

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall cmInstallGenerator::GenerateScript(cmInstallGenerator *this,ostream *os)

{
  ostream *poVar1;
  string component_test;
  
  CreateComponentTest_abi_cxx11_
            (&component_test,(cmInstallGenerator *)os,(this->Component)._M_dataplus._M_p,
             this->ExcludeFromAll);
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x0);
  poVar1 = std::operator<<(poVar1,"if(");
  poVar1 = std::operator<<(poVar1,(string *)&component_test);
  std::operator<<(poVar1,")\n");
  (*(this->super_cmScriptGenerator)._vptr_cmScriptGenerator[3])(this,os,2);
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x0);
  std::operator<<(poVar1,"endif()\n\n");
  std::__cxx11::string::~string((string *)&component_test);
  return;
}

Assistant:

void cmInstallGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str(), this->ExcludeFromAll);
  os << indent << "if(" << component_test << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}